

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

channel_s * fio_channel_find_dup_internal(channel_s *ch_tmp,uint64_t hashed,fio_collection_s *c)

{
  channel_s *ch;
  fio_collection_s *c_local;
  uint64_t hashed_local;
  channel_s *ch_tmp_local;
  
  fio_lock(&c->lock);
  ch_tmp_local = fio_ch_set_find(&c->channels,hashed,ch_tmp);
  if (ch_tmp_local == (channel_s *)0x0) {
    fio_unlock(&c->lock);
    ch_tmp_local = (channel_s *)0x0;
  }
  else {
    fio_channel_dup(ch_tmp_local);
    fio_unlock(&c->lock);
  }
  return ch_tmp_local;
}

Assistant:

static channel_s *fio_channel_find_dup_internal(channel_s *ch_tmp,
                                                uint64_t hashed,
                                                fio_collection_s *c) {
  fio_lock(&c->lock);
  channel_s *ch = fio_ch_set_find(&c->channels, hashed, ch_tmp);
  if (!ch) {
    fio_unlock(&c->lock);
    return NULL;
  }
  fio_channel_dup(ch);
  fio_unlock(&c->lock);
  return ch;
}